

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Convolution::convolve(Convolution *this,double *in,int length)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  int i_1;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  if (this->m_filter_len < length) {
    __assert_fail("length <= m_filter_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/osoumen[P]dpcmc/main.cpp",0x6c,
                  "void Convolution::convolve(double *, int)");
  }
  pdVar5 = this->m_fft_buff;
  uVar9 = 0;
  uVar13 = 0;
  if (0 < length) {
    uVar13 = (ulong)(uint)length;
  }
  for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    pdVar5[uVar9] = in[uVar9];
  }
  iVar3 = this->m_fft_len;
  pdVar5 = this->m_fft_buff;
  for (lVar10 = (long)length; lVar10 < iVar3; lVar10 = lVar10 + 1) {
    pdVar5[lVar10] = 0.0;
  }
  rdft(iVar3,1,pdVar5,this->m_ip,this->m_work);
  pdVar5 = this->m_filter;
  pdVar6 = this->m_fft_buff;
  *pdVar6 = *pdVar5 * *pdVar6;
  pdVar6[1] = pdVar5[1] * pdVar6[1];
  iVar3 = this->m_filter_len;
  lVar12 = 0x10;
  for (lVar10 = 1; lVar10 < iVar3; lVar10 = lVar10 + 1) {
    dVar1 = *(double *)((long)pdVar6 + lVar12);
    dVar2 = *(double *)((long)pdVar6 + lVar12 + 8);
    dVar7 = *(double *)((long)pdVar5 + lVar12);
    dVar8 = ((double *)((long)pdVar5 + lVar12))[1];
    *(double *)((long)pdVar6 + lVar12) = dVar1 * dVar7 + dVar8 * -dVar2;
    ((double *)((long)pdVar6 + lVar12))[1] = dVar1 * dVar8 + dVar7 * dVar2;
    lVar12 = lVar12 + 0x10;
  }
  rdft(this->m_fft_len,-1,pdVar6,this->m_ip,this->m_work);
  pdVar5 = this->m_fft_buff;
  pdVar6 = this->m_filter_result;
  uVar11 = 0;
  uVar9 = (ulong)(uint)this->m_fft_len;
  if (this->m_fft_len < 1) {
    uVar9 = uVar11;
  }
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    pdVar6[uVar11] = pdVar5[uVar11] + pdVar6[uVar11];
  }
  pdVar5 = this->m_filter_result;
  for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    in[uVar9] = pdVar5[uVar9];
  }
  uVar4 = this->m_filter_len;
  pdVar5 = this->m_filter_result;
  uVar9 = 0;
  uVar13 = 0;
  if (0 < (int)uVar4) {
    uVar13 = (ulong)uVar4;
  }
  for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    pdVar5[uVar9] = pdVar5[(long)(int)uVar4 + uVar9];
    pdVar5[(long)(int)uVar4 + uVar9] = 0.0;
  }
  return;
}

Assistant:

void convolve(double *in, int length)
	{
		assert(length <= m_filter_len);
		
		for (int i=0; i<length; ++i) {
			m_fft_buff[i] = in[i];
		}
		for (int i=length; i<m_fft_len; ++i) {
			m_fft_buff[i] = .0;
		}
		rdft(m_fft_len, 1, m_fft_buff, m_ip, m_work);
		m_fft_buff[0] *= m_filter[0];
		m_fft_buff[1] *= m_filter[1];
		for (int i=1; i<m_filter_len; ++i) {
			double realp = m_fft_buff[2*i] * m_filter[2*i] - m_fft_buff[2*i+1] * m_filter[2*i+1];
			double imagp = m_fft_buff[2*i] * m_filter[2*i+1] + m_fft_buff[2*i+1] * m_filter[2*i];
			m_fft_buff[2*i] = realp;
			m_fft_buff[2*i+1] = imagp;
		}
		rdft(m_fft_len, -1, m_fft_buff, m_ip, m_work);
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] += m_fft_buff[i];
		}
		for (int i=0; i<length; ++i) {
			in[i] = m_filter_result[i];
		}
		for (int i=0; i<m_filter_len; ++i) {
			m_filter_result[i] = m_filter_result[i+m_filter_len];
			m_filter_result[i+m_filter_len] = .0;
		}
	}